

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O1

void __thiscall DatalogDatabase::smartEvalRules(DatalogDatabase *this,ostream *out)

{
  pointer *ppvVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint num_nodes;
  int j;
  ulong uVar9;
  undefined1 local_118 [8];
  graph depend_graph;
  vector<int,_std::allocator<int>_> pnums;
  vector<int,_std::allocator<int>_> local_b0;
  undefined1 local_98 [8];
  graph rg;
  undefined1 local_58 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  comps;
  ulong local_38;
  
  num_nodes = (uint)((ulong)((long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
  rg.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  graph::graph((graph *)local_118,num_nodes);
  if (0 < (int)num_nodes) {
    uVar6 = 0;
    do {
      uVar9 = 0;
      do {
        bVar3 = isRuleDependant(*(Rule **)(*(long *)(rg.temp_node_arr.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage + 0xc) + uVar6 * 8),
                                *(Rule **)(*(long *)(rg.temp_node_arr.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage + 0xc) + uVar9 * 8));
        if (bVar3) {
          graph::add_edge((graph *)local_118,(int)uVar6,(int)uVar9);
        }
        uVar9 = uVar9 + 1;
      } while ((num_nodes & 0x7fffffff) != uVar9);
      uVar6 = uVar6 + 1;
    } while (uVar6 != (num_nodes & 0x7fffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Dependency Graph",0x10);
  cVar2 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  graph::toString_abi_cxx11_((string *)local_98,(graph *)local_118);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_98,rg._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_98 != (undefined1  [8])&rg.nodes) {
    operator_delete((void *)local_98);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Reverse Graph",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  graph::reverse((graph *)local_98,(graph *)local_118);
  graph::toString_abi_cxx11_((string *)local_58,(graph *)local_98);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_58,
                      (long)comps.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  ppvVar1 = &comps.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_58);
  }
  graph::DFSForest((vector<int,_std::allocator<int>_> *)
                   &depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,(graph *)local_98);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Postorder Numbers",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  graph::pos_nums_abi_cxx11_((string *)local_58,(graph *)local_98);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_58,
                      (long)comps.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_58 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"SCC Search Order",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &pnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)
             &depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  print_rules(num_nodes,
              (vector<int,_std::allocator<int>_> *)
              &pnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,out);
  if (pnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(pnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  graph::SCC((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_58,(graph *)local_118);
  if ((undefined1  [8])
      comps.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != local_58) {
    local_38 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"SCC:",4);
      lVar8 = *(long *)((long)local_58 + local_38 * 0x18 + 8) -
              *(long *)((long)local_58 + local_38 * 0x18);
      if (lVar8 != 0) {
        lVar7 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(out," R",2);
          std::ostream::operator<<
                    ((ostream *)out,
                     *(int *)(*(long *)((long)local_58 + local_38 * 0x18) + lVar7 * 4));
          lVar7 = lVar7 + 1;
        } while ((lVar8 >> 2) + (ulong)(lVar8 >> 2 == 0) != lVar7);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      if (lVar8 == 4) {
        bVar3 = graph::has_edge((graph *)local_118,**(int **)((long)local_58 + local_38 * 0x18),
                                **(int **)((long)local_58 + local_38 * 0x18));
        if (bVar3) goto LAB_00112006;
        evaluateRule((DatalogDatabase *)
                     rg.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                     *(Rule **)(*(long *)(rg.temp_node_arr.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage + 0xc) +
                               (long)**(int **)((long)local_58 + local_38 * 0x18) * 8),out);
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
      }
      else {
LAB_00112006:
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_b0,(vector<int,_std::allocator<int>_> *)((long)local_58 + local_38 * 0x18)
                  );
        fixed_point((DatalogDatabase *)
                    rg.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_b0,out);
        if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      local_38 = local_38 + 1;
    } while (local_38 <
             (ulong)(((long)comps.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)local_58 >> 3) *
                    -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Rule Evaluation Complete",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  plVar5 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_58);
  if (depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
  }
  if (rg.nodes.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(rg.nodes.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<node,_std::allocator<node>_>::~vector((vector<node,_std::allocator<node>_> *)&rg);
  if (depend_graph.nodes.super__Vector_base<node,_std::allocator<node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(depend_graph.nodes.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<node,_std::allocator<node>_>::~vector
            ((vector<node,_std::allocator<node>_> *)&depend_graph);
  return;
}

Assistant:

void DatalogDatabase::smartEvalRules(ostream& out)
{
  int nrules = rules.size();
  graph depend_graph = graph(nrules);
  for (int i=0; i < nrules; i++)
  {
    for (int j = 0; j < nrules; j++)
    {
      //check if rule i depends on j
      if (isRuleDependant(rules[i], rules[j])) depend_graph.add_edge(i, j);
    }

  }

  //ouput dependancy graph
  out << "Dependency Graph" << endl;
  out << depend_graph.toString() << endl;
  out << "Reverse Graph" << endl;
  graph rg = depend_graph.reverse();
  out << rg.toString() << endl;
  vector<int> pnums = rg.DFSForest();
  out << "Postorder Numbers"  << endl;
  out << rg.pos_nums() << endl;
  out << "SCC Search Order" << endl;
  print_rules(nrules, pnums, out);
  out<<endl;

  vector<vector<int>> comps = depend_graph.SCC();
  for (size_t c= 0; c < comps.size(); c++)
  {
    out << "SCC:";
    size_t csize = comps[c].size();
    for (size_t i = 0; i < csize; i++)
    {
      out << " R" << comps[c][i];
    }
    out << endl;
    if (csize == 1 && !depend_graph.has_edge(comps[c][0], comps[c][0]))
    {
      evaluateRule(rules[comps[c][0]], out);
      out << endl;
      continue;
    }
    fixed_point(comps[c], out);
  }
  out << "Rule Evaluation Complete" << endl << endl;
}